

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void helicsCoreMakeConnections(HelicsCore core,char *file,HelicsError *err)

{
  Core *pCVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Core *cppcore;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  HelicsCore in_stack_ffffffffffffff98;
  bool local_42;
  allocator<char> local_41;
  allocator<char> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  pCVar1 = getCore(in_stack_ffffffffffffff98,(HelicsError *)in_stack_ffffffffffffff90);
  if (pCVar1 != (Core *)0x0) {
    local_42 = in_RSI == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_42) {
      std::__cxx11::string::string(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,
                 in_stack_ffffffffffffffc0);
      in_stack_ffffffffffffff90 = in_RSI;
    }
    local_42 = !local_42;
    (*pCVar1->_vptr_Core[0x46])(pCVar1,&stack0xffffffffffffffc0);
    std::__cxx11::string::~string(in_stack_ffffffffffffff90);
    if (local_42) {
      std::allocator<char>::~allocator(&local_41);
    }
  }
  return;
}

Assistant:

void helicsCoreMakeConnections(HelicsCore core, const char* file, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }
    try {
        cppcore->makeConnections(AS_STRING(file));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}